

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

PointerReader *
capnp::_::PointerReader::getRoot
          (PointerReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          word *location,int nestingLimit)

{
  bool bVar1;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  int nestingLimit_local;
  word *location_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  f.exception._4_4_ = nestingLimit;
  f.exception._2_1_ = WireHelpers::boundsCheck(segment,location,1);
  f.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[29]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xa94,FAILED,"WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS)",
               "_kjCondition,\"Root location out-of-bounds.\"",
               (DebugExpression<bool> *)((long)&f.exception + 3),
               (char (*) [29])"Root location out-of-bounds.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  PointerReader(__return_storage_ptr__,segment,capTable,(WirePointer *)location,f.exception._4_4_);
  return __return_storage_ptr__;
}

Assistant:

PointerReader PointerReader::getRoot(SegmentReader* segment, CapTableReader* capTable,
                                     const word* location, int nestingLimit) {
  KJ_REQUIRE(WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS),
             "Root location out-of-bounds.") {
    location = nullptr;
  }

  return PointerReader(segment, capTable,
      reinterpret_cast<const WirePointer*>(location), nestingLimit);
}